

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unordered_map_constructor_test.h
# Opt level: O0

void __thiscall
phmap::priv::gtest_suite_ConstructorTest_::
AssignmentFromInitializerList<phmap::flat_hash_map<int,_int,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_int>_>_>_>
::TestBody(AssignmentFromInitializerList<phmap::flat_hash_map<int,_int,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_int>_>_>_>
           *this)

{
  Generator<std::pair<const_int,_int>,_void> *this_00;
  _Head_base<0UL,_unsigned_long,_false> *this_01;
  initializer_list<std::pair<const_int,_int>_> iVar1;
  bool bVar2;
  char *message;
  size_type sVar3;
  flat_hash_map<int,_int,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_int>_>_>
  *m_00;
  initializer_list<std::pair<const_int,_int>_> xs;
  AssertHelper local_1b0;
  Message local_1a8;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> local_1a0;
  _Head_base<0UL,_unsigned_long,_false> *local_188;
  iterator ppStack_180;
  UnorderedElementsAreArrayMatcher<std::pair<const_int,_int>_> local_170;
  PredicateFormatterFromMatcher<testing::internal::UnorderedElementsAreArrayMatcher<std::pair<const_int,_int>_>_>
  local_150;
  undefined1 local_130 [8];
  AssertionResult gtest_ar;
  StatefulTestingEqual local_118 [3];
  StatefulTestingHash local_100;
  iterator local_f8;
  iterator ppStack_f0;
  flat_hash_map<int,_int,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_int>_>_>
  local_e0;
  undefined1 local_98 [8];
  TypeParam m;
  initializer_list<std::pair<const_int,_int>_> values;
  Generator<std::pair<const_int,_int>,_void> gen;
  AssignmentFromInitializerList<phmap::flat_hash_map<int,_int,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_int>_>_>_>
  *this_local;
  UnorderedElementsAreArrayMatcher<std::pair<const_int,_int>_> *matcher;
  
  this_00 = (Generator<std::pair<const_int,_int>,_void> *)((long)&values._M_len + 7);
  m.
  super_raw_hash_map<phmap::priv::FlatHashMapPolicy<int,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_int>_>_>
  .
  super_raw_hash_set<phmap::priv::FlatHashMapPolicy<int,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_int>_>_>
  .settings_.
  super__Tuple_impl<0UL,_unsigned_long,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_int>_>_>
  .super__Head_base<0UL,_unsigned_long,_false>._M_head_impl =
       (unsigned_long)hash_internal::Generator<std::pair<const_int,_int>,_void>::operator()(this_00)
  ;
  hash_internal::Generator<std::pair<const_int,_int>,_void>::operator()(this_00);
  hash_internal::Generator<std::pair<const_int,_int>,_void>::operator()(this_00);
  hash_internal::Generator<std::pair<const_int,_int>,_void>::operator()(this_00);
  hash_internal::Generator<std::pair<const_int,_int>,_void>::operator()(this_00);
  this_01 = &m.
             super_raw_hash_map<phmap::priv::FlatHashMapPolicy<int,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_int>_>_>
             .
             super_raw_hash_set<phmap::priv::FlatHashMapPolicy<int,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_int>_>_>
             .settings_.
             super__Tuple_impl<0UL,_unsigned_long,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_int>_>_>
             .super__Head_base<0UL,_unsigned_long,_false>;
  values._M_array = (iterator)0x5;
  flat_hash_map<int,_int,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_int>_>_>
  ::flat_hash_map((flat_hash_map<int,_int,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_int>_>_>
                   *)local_98);
  ppStack_f0 = values._M_array;
  local_100.super_WithId<phmap::priv::StatefulTestingHash>.id_ =
       (WithId<phmap::priv::StatefulTestingHash>)0;
  local_f8 = (iterator)this_01;
  StatefulTestingHash::StatefulTestingHash(&local_100);
  local_118[0].super_WithId<phmap::priv::StatefulTestingEqual>.id_ =
       (WithId<phmap::priv::StatefulTestingEqual>)0;
  StatefulTestingEqual::StatefulTestingEqual(local_118);
  Alloc<std::pair<const_int,_int>_>::Alloc
            ((Alloc<std::pair<const_int,_int>_> *)&gtest_ar.message_,0);
  iVar1._M_len = (size_type)ppStack_f0;
  iVar1._M_array = local_f8;
  sVar3 = 0;
  flat_hash_map<int,_int,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_int>_>_>
  ::raw_hash_set(&local_e0,iVar1,0,&local_100,local_118,(allocator_type *)&gtest_ar.message_);
  flat_hash_map<int,_int,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_int>_>_>
  ::operator=((flat_hash_map<int,_int,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_int>_>_>
               *)local_98,&local_e0);
  flat_hash_map<int,_int,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_int>_>_>
  ::~flat_hash_map(&local_e0);
  Alloc<std::pair<const_int,_int>_>::~Alloc((Alloc<std::pair<const_int,_int>_> *)&gtest_ar.message_)
  ;
  ppStack_180 = values._M_array;
  xs._M_len = sVar3;
  xs._M_array = values._M_array;
  local_188 = this_01;
  testing::UnorderedElementsAreArray<std::pair<int_const,int>>(&local_170,(testing *)this_01,xs);
  testing::internal::
  MakePredicateFormatterFromMatcher<testing::internal::UnorderedElementsAreArrayMatcher<std::pair<int_const,int>>>
            (&local_150,(internal *)&local_170,matcher);
  items<phmap::flat_hash_map<int,int,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<std::pair<int_const,int>>>>
            (&local_1a0,(priv *)local_98,m_00);
  testing::internal::
  PredicateFormatterFromMatcher<testing::internal::UnorderedElementsAreArrayMatcher<std::pair<int_const,int>>>
  ::operator()(local_130,(char *)&local_150,
               (vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)"items(m)");
  std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::~vector(&local_1a0);
  testing::internal::
  PredicateFormatterFromMatcher<testing::internal::UnorderedElementsAreArrayMatcher<std::pair<const_int,_int>_>_>
  ::~PredicateFormatterFromMatcher(&local_150);
  testing::internal::UnorderedElementsAreArrayMatcher<std::pair<const_int,_int>_>::
  ~UnorderedElementsAreArrayMatcher(&local_170);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_130);
  if (!bVar2) {
    testing::Message::Message(&local_1a8);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_130);
    testing::internal::AssertHelper::AssertHelper
              (&local_1b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/unordered_map_constructor_test.h"
               ,0x1b6,message);
    testing::internal::AssertHelper::operator=(&local_1b0,&local_1a8);
    testing::internal::AssertHelper::~AssertHelper(&local_1b0);
    testing::Message::~Message(&local_1a8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_130);
  flat_hash_map<int,_int,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_int>_>_>
  ::~flat_hash_map((flat_hash_map<int,_int,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_int>_>_>
                    *)local_98);
  return;
}

Assistant:

TYPED_TEST_P(ConstructorTest, AssignmentFromInitializerList) {
  using T = hash_internal::GeneratedType<TypeParam>;
  hash_internal::Generator<T> gen;
  std::initializer_list<T> values = {gen(), gen(), gen(), gen(), gen()};
  TypeParam m;
  m = values;
  EXPECT_THAT(items(m), ::testing::UnorderedElementsAreArray(values));
}